

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteErrorFromPosixError(int posixError,int unqliteIOErr)

{
  int unqliteIOErr_local;
  int posixError_local;
  
  switch(posixError) {
  case 0:
    unqliteIOErr_local = 0;
    break;
  case 1:
    unqliteIOErr_local = -0x13;
    break;
  case 2:
  case 5:
  case 6:
  case 9:
  case 0x13:
  case 0x16:
  case 0x26:
  case 0x5f:
  case 0x6b:
  case 0x74:
  default:
    unqliteIOErr_local = unqliteIOErr;
    break;
  case 4:
  case 0xb:
  case 0x10:
  case 0x25:
  case 0x6e:
    unqliteIOErr_local = -0xe;
    break;
  case 0xd:
    unqliteIOErr_local = -0xe;
    break;
  case 0x23:
    unqliteIOErr_local = -2;
  }
  return unqliteIOErr_local;
}

Assistant:

static int unqliteErrorFromPosixError(int posixError, int unqliteIOErr) {
  switch (posixError) {
  case 0: 
    return UNQLITE_OK;
    
  case EAGAIN:
  case ETIMEDOUT:
  case EBUSY:
  case EINTR:
  case ENOLCK:  
    /* random NFS retry error, unless during file system support 
     * introspection, in which it actually means what it says */
    return UNQLITE_BUSY;
 
  case EACCES: 
    /* EACCES is like EAGAIN during locking operations, but not any other time*/
      return UNQLITE_BUSY;
    
  case EPERM: 
    return UNQLITE_PERM;
    
  case EDEADLK:
    return UNQLITE_IOERR;
    
#if EOPNOTSUPP!=ENOTSUP
  case EOPNOTSUPP: 
    /* something went terribly awry, unless during file system support 
     * introspection, in which it actually means what it says */
#endif
#ifdef ENOTSUP
  case ENOTSUP: 
    /* invalid fd, unless during file system support introspection, in which 
     * it actually means what it says */
#endif
  case EIO:
  case EBADF:
  case EINVAL:
  case ENOTCONN:
  case ENODEV:
  case ENXIO:
  case ENOENT:
  case ESTALE:
  case ENOSYS:
    /* these should force the client to close the file and reconnect */
    
  default: 
    return unqliteIOErr;
  }
}